

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O1

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Point *a,S2Point *b)

{
  int iVar1;
  S2Point *pSVar2;
  int i;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  S1ChordAngle SVar6;
  S1ChordAngle SVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  S1ChordAngle min_dist;
  S2EdgeCrosser crosser;
  S2Point v [4];
  S1ChordAngle local_118;
  S1ChordAngle local_110;
  S2EdgeCrosser local_108;
  S2Point local_98;
  S2Point SStack_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  S2Point SStack_50;
  
  SVar6 = GetDistanceInternal(this,a,true);
  SVar7 = GetDistanceInternal(this,b,true);
  if (SVar6.length2_ <= SVar7.length2_) {
    SVar7 = SVar6;
  }
  local_118.length2_ = SVar7.length2_;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_108,0.0);
  if ((SVar7.length2_ != (double)local_108.a_) ||
     (SVar6.length2_ = local_118.length2_, NAN(SVar7.length2_) || NAN((double)local_108.a_))) {
    pSVar2 = &local_98;
    SStack_50.c_[1] = 0.0;
    SStack_50.c_[2] = 0.0;
    local_58 = 0;
    SStack_50.c_[0] = 0.0;
    local_68 = 0;
    uStack_60 = 0;
    SStack_80.c_[1] = 0.0;
    SStack_80.c_[2] = 0.0;
    local_98.c_[2] = 0.0;
    SStack_80.c_[0] = 0.0;
    local_98.c_[0] = 0.0;
    local_98.c_[1] = 0.0;
    lVar3 = 0;
    do {
      GetVertex((S2Point *)&local_108,this,(int)lVar3);
      pSVar2->c_[2] = local_108.a_cross_b_.c_[0];
      pSVar2->c_[0] = (VType)local_108.a_;
      pSVar2->c_[1] = (VType)local_108.b_;
      lVar3 = lVar3 + 1;
      pSVar2 = pSVar2 + 1;
    } while (lVar3 != 4);
    S2EdgeCrosser::S2EdgeCrosser(&local_108,a,b,&SStack_50);
    iVar1 = S2EdgeCrosser::CrossingSign(&local_108,&local_98);
    if (iVar1 < 0) {
      uVar4 = 0xffffffffffffffff;
      pSVar2 = &SStack_80;
      SVar6.length2_ = extraout_XMM0_Qa;
      do {
        if (uVar4 == 2) {
          bVar5 = true;
          goto LAB_001da2bb;
        }
        iVar1 = S2EdgeCrosser::CrossingSign(&local_108,pSVar2);
        uVar4 = uVar4 + 1;
        pSVar2 = pSVar2 + 1;
        SVar6.length2_ = extraout_XMM0_Qa_00;
      } while (iVar1 < 0);
      bVar5 = 2 < uVar4;
    }
    else {
      bVar5 = false;
    }
    S1ChordAngle::S1ChordAngle(&local_110,0.0);
    SVar6.length2_ = local_110.length2_;
LAB_001da2bb:
    if (bVar5) {
      lVar3 = 0;
      do {
        S2::UpdateMinDistance((S2Point *)((long)local_98.c_ + lVar3),a,b,&local_118);
        lVar3 = lVar3 + 0x18;
        SVar6.length2_ = local_118.length2_;
      } while (lVar3 != 0x60);
    }
  }
  return (S1ChordAngle)SVar6.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Point& a, const S2Point& b) const {
  // Possible optimizations:
  //  - Currently the (cell vertex, edge endpoint) distances are computed
  //    twice each, and the length of AB is computed 4 times.
  //  - To fix this, refactor GetDistance(target) so that it skips calculating
  //    the distance to each cell vertex.  Instead, compute the cell vertices
  //    and distances in this function, and add a low-level UpdateMinDistance
  //    that allows the XA, XB, and AB distances to be passed in.
  //  - It might also be more efficient to do all calculations in UVW-space,
  //    since this would involve transforming 2 points rather than 4.

  // First, check the minimum distance to the edge endpoints A and B.
  // (This also detects whether either endpoint is inside the cell.)
  S1ChordAngle min_dist = min(GetDistance(a), GetDistance(b));
  if (min_dist == S1ChordAngle::Zero()) return min_dist;

  // Otherwise, check whether the edge crosses the cell boundary.
  // Note that S2EdgeCrosser needs pointers to vertices.
  S2Point v[4];
  for (int i = 0; i < 4; ++i) {
    v[i] = GetVertex(i);
  }
  S2EdgeCrosser crosser(&a, &b, &v[3]);
  for (int i = 0; i < 4; ++i) {
    if (crosser.CrossingSign(&v[i]) >= 0) {
      return S1ChordAngle::Zero();
    }
  }
  // Finally, check whether the minimum distance occurs between a cell vertex
  // and the interior of the edge AB.  (Some of this work is redundant, since
  // it also checks the distance to the endpoints A and B again.)
  //
  // Note that we don't need to check the distance from the interior of AB to
  // the interior of a cell edge, because the only way that this distance can
  // be minimal is if the two edges cross (already checked above).
  for (int i = 0; i < 4; ++i) {
    S2::UpdateMinDistance(v[i], a, b, &min_dist);
  }
  return min_dist;
}